

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_directive_name(yaml_parser_t *parser,yaml_mark_t start_mark,yaml_char_t **name)

{
  yaml_char_t *pyVar1;
  int iVar2;
  yaml_char_t *pyVar3;
  bool bVar4;
  yaml_char_t *local_38;
  yaml_string_t string;
  yaml_char_t **name_local;
  yaml_parser_t *parser_local;
  
  string.pointer = (yaml_char_t *)name;
  memset(&local_38,0,0x18);
  local_38 = (yaml_char_t *)yaml_malloc(0x10);
  if (local_38 == (yaml_char_t *)0x0) {
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    string.start = local_38 + 0x10;
    string.end = local_38;
    memset(local_38,0,0x10);
    if (parser->unread != 0) goto LAB_0011b16d;
    iVar2 = yaml_parser_update_buffer(parser,1);
    while (iVar2 != 0) {
LAB_0011b16d:
      do {
        if ((((*(parser->buffer).pointer < 0x30) || (bVar4 = true, 0x39 < *(parser->buffer).pointer)
             ) && ((*(parser->buffer).pointer < 0x41 ||
                   (bVar4 = true, 0x5a < *(parser->buffer).pointer)))) &&
           (((*(parser->buffer).pointer < 0x61 || (bVar4 = true, 0x7a < *(parser->buffer).pointer))
            && (bVar4 = true, *(parser->buffer).pointer != '_')))) {
          bVar4 = *(parser->buffer).pointer == '-';
        }
        if (!bVar4) {
          if (local_38 == string.end) {
            yaml_parser_set_scanner_error
                      (parser,"while scanning a directive",start_mark,
                       "could not find expected directive name");
          }
          else {
            if (((((*(parser->buffer).pointer == ' ') || (*(parser->buffer).pointer == '\t')) ||
                 (((*(parser->buffer).pointer == '\r' || (*(parser->buffer).pointer == '\n')) ||
                  ((*(parser->buffer).pointer == 0xc2 && ((parser->buffer).pointer[1] == 0x85))))))
                || ((*(parser->buffer).pointer == 0xe2 &&
                    (((parser->buffer).pointer[1] == 0x80 && ((parser->buffer).pointer[2] == 0xa8)))
                    ))) ||
               (((*(parser->buffer).pointer == 0xe2 &&
                 (((parser->buffer).pointer[1] == 0x80 && ((parser->buffer).pointer[2] == 0xa9))))
                || (*(parser->buffer).pointer == '\0')))) {
              *(yaml_char_t **)string.pointer = local_38;
              return 1;
            }
            yaml_parser_set_scanner_error
                      (parser,"while scanning a directive",start_mark,
                       "found unexpected non-alphabetical character");
          }
          goto LAB_0011b716;
        }
        if ((string.start <= string.end + 5) &&
           (iVar2 = yaml_string_extend(&local_38,&string.end,&string.start), iVar2 == 0)) {
          parser->error = YAML_MEMORY_ERROR;
          goto LAB_0011b716;
        }
        if ((*(parser->buffer).pointer & 0x80) == 0) {
          pyVar1 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar1 + 1;
          *string.end = *pyVar1;
          string.end = string.end + 1;
        }
        else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
          pyVar1 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar1 + 1;
          pyVar3 = string.end + 1;
          *string.end = *pyVar1;
          pyVar1 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar1 + 1;
          string.end = string.end + 2;
          *pyVar3 = *pyVar1;
        }
        else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
          pyVar1 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar1 + 1;
          *string.end = *pyVar1;
          pyVar1 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar1 + 1;
          pyVar3 = string.end + 2;
          string.end[1] = *pyVar1;
          pyVar1 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar1 + 1;
          string.end = string.end + 3;
          *pyVar3 = *pyVar1;
        }
        else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
          pyVar1 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar1 + 1;
          *string.end = *pyVar1;
          pyVar1 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar1 + 1;
          string.end[1] = *pyVar1;
          pyVar1 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar1 + 1;
          pyVar3 = string.end + 3;
          string.end[2] = *pyVar1;
          pyVar1 = (parser->buffer).pointer;
          (parser->buffer).pointer = pyVar1 + 1;
          string.end = string.end + 4;
          *pyVar3 = *pyVar1;
        }
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = (parser->mark).column + 1;
        parser->unread = parser->unread - 1;
      } while (parser->unread != 0);
      iVar2 = yaml_parser_update_buffer(parser,1);
    }
  }
LAB_0011b716:
  yaml_free(local_38);
  return 0;
}

Assistant:

static int
yaml_parser_scan_directive_name(yaml_parser_t *parser,
        yaml_mark_t start_mark, yaml_char_t **name)
{
    yaml_string_t string = NULL_STRING;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;

    /* Consume the directive name. */

    if (!CACHE(parser, 1)) goto error;

    while (IS_ALPHA(parser->buffer))
    {
        if (!READ(parser, string)) goto error;
        if (!CACHE(parser, 1)) goto error;
    }

    /* Check if the name is empty. */

    if (string.start == string.pointer) {
        yaml_parser_set_scanner_error(parser, "while scanning a directive",
                start_mark, "could not find expected directive name");
        goto error;
    }

    /* Check for an blank character after the name. */

    if (!IS_BLANKZ(parser->buffer)) {
        yaml_parser_set_scanner_error(parser, "while scanning a directive",
                start_mark, "found unexpected non-alphabetical character");
        goto error;
    }

    *name = string.start;

    return 1;

error:
    STRING_DEL(parser, string);
    return 0;
}